

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O3

int slang::ast::TimingControl::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  Compilation *compilation;
  ulong uVar2;
  InvalidTimingControl *pIVar3;
  undefined4 in_register_0000003c;
  SignalEventExpressionSyntax *syntax;
  SourceRange sourceRange;
  ASTContext ctx;
  ASTContext local_58;
  TimingControl *local_18;
  
  syntax = (SignalEventExpressionSyntax *)CONCAT44(in_register_0000003c,__fd);
  local_58.scope.ptr = *(Scope **)__addr;
  local_58._8_8_ = *(undefined8 *)(__addr->sa_data + 6);
  uVar2._0_2_ = __addr[1].sa_family;
  uVar2._2_1_ = __addr[1].sa_data[0];
  uVar2._3_1_ = __addr[1].sa_data[1];
  uVar2._4_1_ = __addr[1].sa_data[2];
  uVar2._5_1_ = __addr[1].sa_data[3];
  uVar2._6_1_ = __addr[1].sa_data[4];
  uVar2._7_1_ = __addr[1].sa_data[5];
  local_58.instanceOrProc = *(Symbol **)(__addr[1].sa_data + 6);
  local_58.firstTempVar = *(TempVarSymbol **)(__addr + 2);
  local_58.randomizeDetails = *(RandomizeDetails **)(__addr[2].sa_data + 6);
  local_58.assertionInstance = *(AssertionInstanceDetails **)(__addr + 3);
  local_58.flags.m_bits = uVar2 | 0x10;
  compilation = (local_58.scope.ptr)->compilation;
  SVar1 = (syntax->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.kind;
  if ((int)SVar1 < 0x1a9) {
    if ((SVar1 != OrSequenceExpr) && (SVar1 != ParenthesizedSequenceExpr)) {
LAB_00345333:
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(&local_58,(DiagCode)0x280008,sourceRange);
      local_18 = (TimingControl *)0x0;
      pIVar3 = BumpAllocator::
               emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                         (&compilation->super_BumpAllocator,&local_18);
      goto LAB_00345376;
    }
    pIVar3 = (InvalidTimingControl *)
             EventListControl::fromSyntax(compilation,(SyntaxNode *)syntax,&local_58);
  }
  else if (SVar1 == SignalEventExpression) {
    pIVar3 = (InvalidTimingControl *)SignalEventControl::fromSyntax(compilation,syntax,&local_58);
  }
  else {
    if (SVar1 != SimpleSequenceExpr) goto LAB_00345333;
    pIVar3 = (InvalidTimingControl *)
             SignalEventControl::fromSyntax
                       (compilation,(SimpleSequenceExprSyntax *)syntax,&local_58);
  }
  (pIVar3->super_TimingControl).syntax = (SyntaxNode *)syntax;
LAB_00345376:
  return (int)pIVar3;
}

Assistant:

TimingControl& TimingControl::bind(const SequenceExprSyntax& syntax, const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    auto& comp = ctx.getCompilation();
    TimingControl* result;
    switch (syntax.kind) {
        case SyntaxKind::SimpleSequenceExpr:
            result = &SignalEventControl::fromSyntax(comp, syntax.as<SimpleSequenceExprSyntax>(),
                                                     ctx);
            break;
        case SyntaxKind::ParenthesizedSequenceExpr:
            result = &EventListControl::fromSyntax(comp,
                                                   syntax.as<ParenthesizedSequenceExprSyntax>(),
                                                   ctx);
            break;
        case SyntaxKind::OrSequenceExpr:
            result = &EventListControl::fromSyntax(comp, syntax.as<BinarySequenceExprSyntax>(),
                                                   ctx);
            break;
        case SyntaxKind::SignalEventExpression:
            result = &SignalEventControl::fromSyntax(comp, syntax.as<SignalEventExpressionSyntax>(),
                                                     ctx);
            break;
        default:
            ctx.addDiag(diag::InvalidSyntaxInEventExpr, syntax.sourceRange());
            return badCtrl(comp, nullptr);
    }

    result->syntax = &syntax;
    return *result;
}